

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O2

void __thiscall
cmCTestSubmitHandler::ResponseParser::StartElement(ResponseParser *this,string *name,char **atts)

{
  pointer pcVar1;
  bool bVar2;
  
  pcVar1 = (this->CurrentValue).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->CurrentValue).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar1) {
    (this->CurrentValue).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar1;
  }
  bVar2 = std::operator==(name,"cdash");
  if (bVar2) {
    cmXMLParser::FindAttribute(atts,"version");
    std::__cxx11::string::assign((char *)&this->CDashVersion);
    return;
  }
  return;
}

Assistant:

virtual void StartElement(const std::string& name, const char** atts)
    {
    this->CurrentValue.clear();
    if(name == "cdash")
      {
      this->CDashVersion = this->FindAttribute(atts, "version");
      }
    }